

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cod_node.c
# Opt level: O0

sm_list cod_copy_list(sm_list list)

{
  sm_ref psVar1;
  sm_list plVar2;
  long in_RDI;
  sm_list new_list;
  sm_ref in_stack_00000068;
  sm_list list_00;
  
  list_00 = (sm_list)0x0;
  if (in_RDI != 0) {
    list_00 = (sm_list)malloc(0x10);
    psVar1 = cod_copy(in_stack_00000068);
    list_00->node = psVar1;
    plVar2 = cod_copy_list(list_00);
    list_00->next = plVar2;
  }
  return list_00;
}

Assistant:

extern sm_list cod_copy_list(sm_list list)
{
    sm_list new_list = NULL;
    if (list != NULL) {
        new_list = malloc(sizeof(*new_list));
        new_list->node = cod_copy(list->node);
        new_list->next = cod_copy_list(list->next);
    }
    return new_list;
}